

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn5s>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn5s *r1,yarn5s *r2,long N,long skip1,long skip2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_b4;
  yarn5s *local_b0;
  yarn5s *local_a8;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_b0 = r2;
  local_a8 = r1;
  local_58 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_48 = skip1;
  local_40 = skip2;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98,N);
    lVar14 = 0;
    local_50 = N;
    do {
      lVar13 = lVar14;
      iVar7 = (local_a8->S).r[0];
      iVar1 = (local_a8->S).r[1];
      iVar2 = (local_a8->S).r[2];
      iVar10 = (local_a8->S).r[3];
      uVar11 = (long)(local_a8->P).a[3] * (long)iVar10 + (long)(local_a8->P).a[2] * (long)iVar2 +
               (long)(local_a8->P).a[1] * (long)iVar1 + (long)(local_a8->P).a[0] * (long)iVar7;
      uVar12 = uVar11 + 0x8000b0e1c2e43c3e;
      if (uVar11 < 0x7fff4f1e3d1bc3c2) {
        uVar12 = uVar11;
      }
      uVar12 = (long)(local_a8->S).r[4] * (long)(local_a8->P).a[4] + uVar12;
      (local_a8->S).r[4] = iVar10;
      (local_a8->S).r[3] = iVar2;
      (local_a8->S).r[2] = iVar1;
      uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
      uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
      uVar3 = (uint)uVar12;
      uVar5 = uVar3 + 0x80005871;
      if (uVar12 < 0x7fffa78f) {
        uVar5 = uVar3;
      }
      (local_a8->S).r[1] = iVar7;
      (local_a8->S).r[0] = uVar5;
      local_b4 = 0;
      if (uVar5 != 0) {
        uVar12 = ((ulong)*(uint *)(trng::yarn5s::g + (ulong)(uVar5 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn5s::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                 0x1f) * -0x7fffa78f +
                 (ulong)*(uint *)(trng::yarn5s::g + (ulong)(uVar5 & 0xffff) * 4) *
                 (ulong)*(uint *)(trng::yarn5s::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000);
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        iVar7 = (int)uVar12;
        local_b4 = iVar7 + -0x7fffa78f;
        if (uVar12 < 0x7fffa78f) {
          local_b4 = iVar7;
        }
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b4);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_b4;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar7 = (local_b0->S).r[0];
      iVar1 = (local_b0->S).r[1];
      iVar2 = (local_b0->S).r[2];
      iVar10 = (local_b0->S).r[3];
      uVar11 = (long)(local_b0->P).a[3] * (long)iVar10 + (long)(local_b0->P).a[2] * (long)iVar2 +
               (long)(local_b0->P).a[1] * (long)iVar1 + (long)(local_b0->P).a[0] * (long)iVar7;
      uVar12 = uVar11 + 0x8000b0e1c2e43c3e;
      if (uVar11 < 0x7fff4f1e3d1bc3c2) {
        uVar12 = uVar11;
      }
      uVar12 = (long)(local_b0->S).r[4] * (long)(local_b0->P).a[4] + uVar12;
      (local_b0->S).r[4] = iVar10;
      (local_b0->S).r[3] = iVar2;
      (local_b0->S).r[2] = iVar1;
      (local_b0->S).r[1] = iVar7;
      uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
      uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
      uVar3 = (uint)uVar12;
      uVar5 = uVar3 + 0x80005871;
      if (uVar12 < 0x7fffa78f) {
        uVar5 = uVar3;
      }
      (local_b0->S).r[0] = uVar5;
      if (uVar5 == 0) {
        local_b4 = 0;
      }
      else {
        uVar12 = ((ulong)*(uint *)(trng::yarn5s::g + (ulong)(uVar5 & 0xffff) * 4) *
                  (ulong)*(uint *)(trng::yarn5s::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                 0x1f) * -0x7fffa78f +
                 (ulong)*(uint *)(trng::yarn5s::g + (ulong)(uVar5 & 0xffff) * 4) *
                 (ulong)*(uint *)(trng::yarn5s::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000);
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        iVar7 = (int)uVar12;
        local_b4 = iVar7 + -0x7fffa78f;
        if (uVar12 < 0x7fffa78f) {
          local_b4 = iVar7;
        }
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b4);
      }
      else {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_b4;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_48) {
        local_a0 = (long)(local_a8->P).a[0];
        lVar14 = local_48;
        iVar7 = (local_a8->S).r[4];
        iVar1 = (local_a8->S).r[3];
        iVar2 = (local_a8->S).r[2];
        iVar10 = (local_a8->S).r[0];
        iVar9 = (local_a8->S).r[1];
        do {
          iVar4 = iVar9;
          iVar9 = iVar10;
          iVar8 = iVar2;
          iVar6 = iVar1;
          uVar11 = (long)iVar6 * (long)(local_a8->P).a[3] + (long)iVar8 * (long)(local_a8->P).a[2] +
                   (long)iVar4 * (long)(local_a8->P).a[1] + iVar9 * local_a0;
          uVar12 = uVar11 + 0x8000b0e1c2e43c3e;
          if (uVar11 < 0x7fff4f1e3d1bc3c2) {
            uVar12 = uVar11;
          }
          uVar12 = (long)iVar7 * (long)(local_a8->P).a[4] + uVar12;
          uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
          uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
          iVar7 = (int)uVar12;
          iVar10 = iVar7 + -0x7fffa78f;
          if (uVar12 < 0x7fffa78f) {
            iVar10 = iVar7;
          }
          lVar14 = lVar14 + -1;
          iVar7 = iVar6;
          iVar1 = iVar8;
          iVar2 = iVar4;
        } while (lVar14 != 0);
        (local_a8->S).r[4] = iVar6;
        (local_a8->S).r[3] = iVar8;
        (local_a8->S).r[2] = iVar4;
        (local_a8->S).r[1] = iVar9;
        (local_a8->S).r[0] = iVar10;
        N = local_50;
      }
      if (0 < local_40) {
        local_a0 = (long)(local_b0->P).a[0];
        lVar14 = local_40;
        iVar7 = (local_b0->S).r[4];
        iVar1 = (local_b0->S).r[3];
        iVar2 = (local_b0->S).r[2];
        iVar10 = (local_b0->S).r[0];
        iVar9 = (local_b0->S).r[1];
        do {
          iVar8 = iVar9;
          iVar9 = iVar10;
          iVar4 = iVar2;
          iVar6 = iVar1;
          uVar11 = (long)iVar6 * (long)(local_b0->P).a[3] + (long)iVar4 * (long)(local_b0->P).a[2] +
                   (long)iVar8 * (long)(local_b0->P).a[1] + iVar9 * local_a0;
          uVar12 = uVar11 + 0x8000b0e1c2e43c3e;
          if (uVar11 < 0x7fff4f1e3d1bc3c2) {
            uVar12 = uVar11;
          }
          uVar12 = (long)iVar7 * (long)(local_b0->P).a[4] + uVar12;
          uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
          uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
          iVar7 = (int)uVar12;
          iVar10 = iVar7 + -0x7fffa78f;
          if (uVar12 < 0x7fffa78f) {
            iVar10 = iVar7;
          }
          lVar14 = lVar14 + -1;
          iVar7 = iVar6;
          iVar1 = iVar4;
          iVar2 = iVar8;
        } while (lVar14 != 0);
        (local_b0->S).r[4] = iVar6;
        (local_b0->S).r[3] = iVar4;
        (local_b0->S).r[2] = iVar8;
        (local_b0->S).r[1] = iVar9;
        (local_b0->S).r[0] = iVar10;
        N = local_50;
      }
      lVar14 = lVar13 + 1;
      local_38 = lVar13;
    } while (lVar13 + 1 != N);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_58,&local_78,&local_98);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_58;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}